

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

int minimalInitialFlip(word *pInOut,int nVars,uint *p_uCanonPhase)

{
  word wVar1;
  int iVar2;
  word oneWord;
  uint *p_uCanonPhase_local;
  int nVars_local;
  word *pInOut_local;
  
  iVar2 = Kit_TruthWordNum_64bit(nVars);
  wVar1 = pInOut[iVar2 + -1];
  if ((long)wVar1 < 0) {
    Kit_TruthNot_64bit(pInOut,nVars);
    *p_uCanonPhase = 1 << ((byte)nVars & 0x1f) ^ *p_uCanonPhase;
  }
  pInOut_local._4_4_ = (uint)((long)wVar1 < 0);
  return pInOut_local._4_4_;
}

Assistant:

int minimalInitialFlip(word* pInOut, int  nVars, unsigned* p_uCanonPhase)
{
    word oneWord=1;
    if(  (pInOut[Kit_TruthWordNum_64bit( nVars ) -1]>>63) & oneWord )
    {
        Kit_TruthNot_64bit( pInOut, nVars );
        *p_uCanonPhase ^= (1 << nVars);
        return 1;
    }
    return 0;
}